

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.cpp
# Opt level: O0

void __thiscall smf::Options::reset(Options *this)

{
  Option_register *this_00;
  size_type sVar1;
  reference ppOVar2;
  uint local_14;
  uint i;
  Options *this_local;
  
  local_14 = 0;
  while( true ) {
    sVar1 = std::vector<smf::Option_register_*,_std::allocator<smf::Option_register_*>_>::size
                      (&this->m_optionRegister);
    if (sVar1 <= local_14) break;
    ppOVar2 = std::vector<smf::Option_register_*,_std::allocator<smf::Option_register_*>_>::
              operator[](&this->m_optionRegister,(ulong)local_14);
    this_00 = *ppOVar2;
    if (this_00 != (Option_register *)0x0) {
      Option_register::~Option_register(this_00);
      operator_delete(this_00);
    }
    ppOVar2 = std::vector<smf::Option_register_*,_std::allocator<smf::Option_register_*>_>::
              operator[](&this->m_optionRegister,(ulong)local_14);
    *ppOVar2 = (value_type)0x0;
    local_14 = local_14 + 1;
  }
  std::vector<smf::Option_register_*,_std::allocator<smf::Option_register_*>_>::clear
            (&this->m_optionRegister);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&this->m_argument);
  std::__cxx11::string::clear();
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&this->m_extraArgv);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&this->m_extraArgv_strings);
  this->m_oargc = -1;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&this->m_oargv);
  return;
}

Assistant:

void Options::reset(void) {
   unsigned int i;
   for (i=0; i<m_optionRegister.size(); i++) {
      delete m_optionRegister[i];
      m_optionRegister[i] = NULL;
   }
   m_optionRegister.clear();

   m_argument.clear();
   m_commandString.clear();
   m_extraArgv.clear();
   m_extraArgv_strings.clear();

   m_oargc = -1;
   m_oargv.clear();
}